

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  ImDrawChannel *__dest;
  void *pvVar12;
  void *__dest_00;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar16 = (this->_Channels).Capacity;
    if (iVar16 < channels_count) {
      if (iVar16 == 0) {
        iVar18 = 8;
      }
      else {
        iVar18 = iVar16 / 2 + iVar16;
      }
      if (iVar18 <= channels_count) {
        iVar18 = channels_count;
      }
      if (iVar16 < iVar18) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar18 << 5);
        pIVar5 = (this->_Channels).Data;
        if (pIVar5 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar5,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar18;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_ChannelsCount = channels_count;
  pIVar5 = (this->_Channels).Data;
  (pIVar5->IdxBuffer).Size = 0;
  (pIVar5->IdxBuffer).Capacity = 0;
  (pIVar5->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar5->CmdBuffer).Size = 0;
  (pIVar5->CmdBuffer).Capacity = 0;
  (pIVar5->CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar14 = 1;
    lVar15 = 0x38;
    do {
      pIVar5 = (this->_Channels).Data;
      puVar2 = (undefined8 *)((long)&(pIVar5->CmdBuffer).Size + lVar15);
      if ((long)uVar14 < (long)iVar4) {
        iVar16 = *(int *)((long)pIVar5 + lVar15 + -0x14);
        if (iVar16 < 0) {
          uVar17 = iVar16 / 2 + iVar16;
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          pvVar12 = ImGui::MemAlloc((ulong)uVar17 * 0x30);
          pvVar6 = *(void **)((long)pIVar5 + lVar15 + -0x10);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar12,pvVar6,(long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar15 + -0x10) = pvVar12;
          *(uint *)((long)pIVar5 + lVar15 + -0x14) = uVar17;
        }
        *(undefined4 *)(puVar2 + -3) = 0;
        pIVar5 = (this->_Channels).Data;
        iVar16 = *(int *)((long)pIVar5 + lVar15 + -4);
        if (iVar16 < 0) {
          iVar16 = iVar16 / 2 + iVar16;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          pvVar12 = ImGui::MemAlloc((ulong)(uint)(iVar16 * 2));
          pvVar6 = *(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar12,pvVar6,(long)*(int *)((long)pIVar5 + lVar15 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15));
          }
          *(void **)((long)&(pIVar5->CmdBuffer).Size + lVar15) = pvVar12;
          *(int *)((long)pIVar5 + lVar15 + -4) = iVar16;
        }
        *(undefined4 *)((long)pIVar5 + lVar15 + -8) = 0;
      }
      else {
        puVar2[-1] = 0;
        *puVar2 = 0;
        puVar2[-3] = 0;
        puVar2[-2] = 0;
      }
      pIVar5 = (this->_Channels).Data;
      if (*(int *)((long)pIVar5 + lVar15 + -0x18) == 0) {
        pIVar1 = (this->_ClipRectStack).Data + (long)(this->_ClipRectStack).Size + -1;
        lVar8._0_4_ = pIVar1->x;
        lVar8._4_4_ = pIVar1->y;
        uVar9 = pIVar1->z;
        uVar10 = pIVar1->w;
        pvVar6 = (this->_TextureIdStack).Data[(long)(this->_TextureIdStack).Size + -1];
        if (*(int *)((long)pIVar5 + lVar15 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x180);
          pvVar12 = *(void **)((long)pIVar5 + lVar15 + -0x10);
          if (pvVar12 != (void *)0x0) {
            memcpy(__dest_00,pvVar12,(long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar15 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar5 + lVar15 + -0x14) = 8;
        }
        lVar7 = *(long *)((long)pIVar5 + lVar15 + -0x10);
        lVar13 = (long)*(int *)((long)pIVar5 + lVar15 + -0x18) * 0x30;
        *(ulong *)(lVar7 + 0x10 + lVar13) = CONCAT44(uStack_34,uVar10);
        lVar11 = CONCAT44(uVar9,lVar8._4_4_);
        *(long *)(lVar7 + lVar13) = lVar8 << 0x20;
        ((long *)(lVar7 + lVar13))[1] = lVar11;
        *(void **)(lVar7 + 0x18 + lVar13) = pvVar6;
        puVar2 = (undefined8 *)(lVar7 + 0x20 + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        piVar3 = (int *)((long)pIVar5 + lVar15 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x20;
    } while ((uint)channels_count != uVar14);
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}